

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

bool __thiscall
slang::parsing::Preprocessor::evalConditionalExpr
          (Preprocessor *this,ConditionalDirectiveExpressionSyntax *expr)

{
  ushort uVar1;
  SyntaxKind SVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  BinaryConditionalDirectiveExpressionSyntax *bcde;
  byte local_29;
  
  bVar5 = 0;
  while( true ) {
    for (; SVar2 = ((SyntaxNode *)&(expr->super_SyntaxNode).kind)->kind,
        SVar2 == ParenthesizedConditionalDirectiveExpression;
        expr = (ConditionalDirectiveExpressionSyntax *)(&expr->super_SyntaxNode)[1].previewNode) {
    }
    if (SVar2 == BinaryConditionalDirectiveExpression) break;
    if (SVar2 != UnaryConditionalDirectiveExpression) {
      evalConditionalExpr();
LAB_001b461c:
      return (bool)((bVar5 ^ local_29) & 1);
    }
    expr = (ConditionalDirectiveExpressionSyntax *)(&expr->super_SyntaxNode)[1].previewNode;
    bVar5 = bVar5 ^ 1;
  }
  bVar3 = evalConditionalExpr(this,*(ConditionalDirectiveExpressionSyntax **)
                                    (&expr->super_SyntaxNode + 1));
  bVar4 = evalConditionalExpr(this,*(ConditionalDirectiveExpressionSyntax **)
                                    (&expr->super_SyntaxNode + 2));
  uVar1 = *(ushort *)&(&expr->super_SyntaxNode)[1].parent;
  if (uVar1 < 0x54) {
    if (uVar1 != 0x26) {
      local_29 = bVar3 == bVar4;
      goto LAB_001b461c;
    }
    bVar3 = !bVar3;
  }
  else if (uVar1 != 0x54) {
    local_29 = bVar3 && bVar4;
    goto LAB_001b461c;
  }
  local_29 = bVar3 | bVar4;
  goto LAB_001b461c;
}

Assistant:

bool Preprocessor::evalConditionalExpr(
    const syntax::ConditionalDirectiveExpressionSyntax& expr) const {

    switch (expr.kind) {
        case SyntaxKind::ParenthesizedConditionalDirectiveExpression:
            return evalConditionalExpr(
                *expr.as<ParenthesizedConditionalDirectiveExpressionSyntax>().operand);
        case SyntaxKind::UnaryConditionalDirectiveExpression:
            // Only one kind of unary operator.
            return !evalConditionalExpr(
                *expr.as<UnaryConditionalDirectiveExpressionSyntax>().operand);
        case SyntaxKind::BinaryConditionalDirectiveExpression: {
            auto& bcde = expr.as<BinaryConditionalDirectiveExpressionSyntax>();
            const bool l = evalConditionalExpr(*bcde.left);
            const bool r = evalConditionalExpr(*bcde.right);
            switch (bcde.op.kind) {
                case TokenKind::DoubleAnd:
                    return l && r;
                case TokenKind::DoubleOr:
                    return l || r;
                case TokenKind::MinusArrow:
                    return !l || r;
                case TokenKind::LessThanMinusArrow:
                    return l == r;
                default:
                    SLANG_UNREACHABLE;
            }
        }
        case SyntaxKind::NamedConditionalDirectiveExpression:
            return macros.find(
                       expr.as<NamedConditionalDirectiveExpressionSyntax>().name.valueText()) !=
                   macros.end();
        default:
            SLANG_UNREACHABLE;
    }
}